

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O2

void __thiscall VideoEngine::Canvas::Canvas(Canvas *this,int w,int h)

{
  Texture *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  Program *rhs;
  allocator<char> local_96;
  allocator<char> local_95;
  GLuint depth_renderbuffer;
  Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  p;
  string local_68;
  string local_48;
  
  (this->program_).handle_.name_ = 0;
  this_00 = &this->color_;
  Texture::Texture(this_00);
  Framebuffer::Framebuffer(&this->fb_);
  Texture::alloc(this_00,w,h,RGBA8);
  glBindFramebuffer(0x8d40,(this->fb_).name);
  GLCHECK("glBindFramebuffer(GL_FRAMEBUFFER, fb_.name)");
  glGenRenderbuffers(1,&depth_renderbuffer);
  GLCHECK("glGenRenderbuffers(1, &depth_renderbuffer)");
  glBindRenderbuffer(0x8d41,depth_renderbuffer);
  GLCHECK("glBindRenderbuffer(GL_RENDERBUFFER, depth_renderbuffer)");
  glRenderbufferStorage(0x8d41,0x1902,w,h);
  GLCHECK("glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT, w, h)");
  glBindRenderbuffer(0x8d41,0);
  GLCHECK("glBindRenderbuffer(GL_RENDERBUFFER, 0)");
  glFramebufferRenderbuffer(0x8d40,0x8d00,0x8d41,depth_renderbuffer);
  GLCHECK(
         "glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depth_renderbuffer)"
         );
  Framebuffer::attachColorTexture(&this->fb_,0,this_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "#version 130\nuniform sampler2D frame;\nuniform vec2 R;\nvoid main() {\nvec2 ts = vec2(textureSize(frame, 0));\nvec2 k = ts / R;\nfloat scale = max(k.x, k.y);\nvec2 off = (R-ts/scale)/2. * vec2(step(k.x, k.y), step(k.y, k.x));\nvec2 tc = scale * (gl_FragCoord.xy - off);\ngl_FragColor = vec4(0.);\nif (tc.x >= 0. && tc.x < ts.x && tc.y >= 0. && tc.y < ts.y)\ngl_FragColor = texture2D(frame, tc / (ts + vec2(1.)));\n}\n"
             ,&local_95);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"void main() { gl_Position = gl_Vertex; }",&local_96);
  Program::create(&p,&local_48,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (p.has_value_ == false) {
    pbVar1 = Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&p);
    aAppDebugPrintf("[CRASH] Cannot create canvas program: %s",(pbVar1->_M_dataplus)._M_p);
    aAppTerminate(-1);
  }
  rhs = Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::value(&p);
  Program::Handle::operator=((Handle *)this,&rhs->handle_);
  Expected<Program,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&p);
  return;
}

Assistant:

Canvas(int w, int h) {
		color_.alloc(w, h, RGBA8);
		GL(glBindFramebuffer(GL_FRAMEBUFFER, fb_.name));

		GLuint depth_renderbuffer;
		GL(glGenRenderbuffers(1, &depth_renderbuffer));
		GL(glBindRenderbuffer(GL_RENDERBUFFER, depth_renderbuffer));
		GL(glRenderbufferStorage(GL_RENDERBUFFER, GL_DEPTH_COMPONENT, w, h));
		GL(glBindRenderbuffer(GL_RENDERBUFFER, 0));
		GL(glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_DEPTH_ATTACHMENT, GL_RENDERBUFFER, depth_renderbuffer));
		//GL(glDeleteRenderbuffers(1, &depth_renderbuffer));

		fb_.attachColorTexture(0, color_);

		auto p = Program::create(
			"#version 130\n"
			"uniform sampler2D frame;\n"
			"uniform vec2 R;\n"
			"void main() {\n"
				"vec2 ts = vec2(textureSize(frame, 0));\n"
				"vec2 k = ts / R;\n"
				"float scale = max(k.x, k.y);\n"
				"vec2 off = (R-ts/scale)/2. * vec2(step(k.x, k.y), step(k.y, k.x));\n"
				"vec2 tc = scale * (gl_FragCoord.xy - off);\n"
				"gl_FragColor = vec4(0.);\n"
				"if (tc.x >= 0. && tc.x < ts.x && tc.y >= 0. && tc.y < ts.y)\n"
					"gl_FragColor = texture2D(frame, tc / (ts + vec2(1.)));\n"
			"}\n",
			"void main() { gl_Position = gl_Vertex; }");

		if (!p)
			CRASH("Cannot create canvas program: %s", p.error().c_str());

		program_ = std::move(p).value();
	}